

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

token * get_next_token(token *__return_storage_ptr__,iit *iter,iit *end)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  token *e;
  char *pcVar6;
  TokenType local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  uint *local_50;
  ulong local_48;
  uint local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  local_48 = 0;
  local_40 = local_40 & 0xffffff00;
  local_50 = &local_40;
  bVar4 = skip_space(iter,end);
  if (!bVar4) {
    pcVar2 = end->_M_current;
    __return_storage_ptr__->toktype = tokEOF;
    (__return_storage_ptr__->lexeme)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->lexeme).field_2;
    (__return_storage_ptr__->lexeme)._M_string_length = 0;
    (__return_storage_ptr__->lexeme).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->start_iter)._M_current = pcVar2;
    (__return_storage_ptr__->end_iter)._M_current = pcVar2;
    return __return_storage_ptr__;
  }
  pcVar2 = iter->_M_current;
  uStack_60 = SUB84(pcVar2,0);
  uStack_5c = (undefined4)((ulong)pcVar2 >> 0x20);
  std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,0x102030);
  pcVar6 = iter->_M_current;
  cVar1 = *pcVar6;
  if (cVar1 == '(') {
    local_68 = 5;
LAB_00101866:
    std::__cxx11::string::_M_replace_aux((ulong)&local_50,0,local_48,'\x01');
    pcVar6 = iter->_M_current;
    iter->_M_current = pcVar6 + 1;
    (__return_storage_ptr__->end_iter)._M_current = pcVar6 + 1;
    *(ulong *)__return_storage_ptr__ = CONCAT44(uStack_64,local_68);
    (__return_storage_ptr__->start_iter)._M_current = pcVar2;
    (__return_storage_ptr__->lexeme)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->lexeme).field_2;
    if (local_50 == &local_40) {
LAB_00101942:
      *(uint *)&(__return_storage_ptr__->lexeme).field_2 = local_40;
      *(undefined4 *)((long)&(__return_storage_ptr__->lexeme).field_2 + 4) = uStack_3c;
      *(undefined4 *)((long)&(__return_storage_ptr__->lexeme).field_2 + 8) = uStack_38;
      *(undefined4 *)((long)&(__return_storage_ptr__->lexeme).field_2 + 0xc) = uStack_34;
      goto LAB_00101945;
    }
  }
  else {
    if (cVar1 == ')') {
      local_68 = 6;
      goto LAB_00101866;
    }
    if (cVar1 == ';') {
      local_68 = 4;
      goto LAB_00101866;
    }
    while (pcVar3 = end->_M_current, pcVar6 != pcVar3) {
      cVar1 = *pcVar6;
      iVar5 = isalnum((int)cVar1);
      if ((iVar5 == 0) && (cVar1 != '_')) break;
      std::__cxx11::string::push_back((char)&local_50);
      pcVar6 = iter->_M_current + 1;
      iter->_M_current = pcVar6;
    }
    if (pcVar6 == pcVar2) {
      __return_storage_ptr__->toktype = tokEOF;
      (__return_storage_ptr__->lexeme)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->lexeme).field_2;
      (__return_storage_ptr__->lexeme)._M_string_length = 0;
      (__return_storage_ptr__->lexeme).field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->start_iter)._M_current = pcVar3;
      (__return_storage_ptr__->end_iter)._M_current = pcVar3;
      if (local_50 == &local_40) {
        return __return_storage_ptr__;
      }
      operator_delete(local_50,CONCAT44(uStack_3c,local_40) + 1);
      return __return_storage_ptr__;
    }
    iVar5 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar5 == 0) {
      local_68 = tokVar;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar5 == 0) {
        local_68 = tokFunc;
      }
      else {
        local_68 = tokIdent;
      }
    }
    (__return_storage_ptr__->end_iter)._M_current = iter->_M_current;
    __return_storage_ptr__->toktype = local_68;
    *(ulong *)&__return_storage_ptr__->field_0x4 = CONCAT44(uStack_60,uStack_64);
    *(undefined4 *)((long)&(__return_storage_ptr__->start_iter)._M_current + 4) = uStack_5c;
    (__return_storage_ptr__->lexeme)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->lexeme).field_2;
    if (local_50 == &local_40) goto LAB_00101942;
  }
  (__return_storage_ptr__->lexeme)._M_dataplus._M_p = (pointer)local_50;
  (__return_storage_ptr__->lexeme).field_2._M_allocated_capacity = CONCAT44(uStack_3c,local_40);
LAB_00101945:
  (__return_storage_ptr__->lexeme)._M_string_length = local_48;
  return __return_storage_ptr__;
}

Assistant:

token get_next_token(iit &iter, iit &end) {
    token retval;
    
    if (! skip_space(iter, end)) {
        return token::mkend(end);
    }
    
    // skip_space guarantees we are not at the end of 
    // input but are at a non-space character.
    
    retval.start_iter = iter;
    retval.lexeme = "";
    
    // check punctuation first
    switch (*iter) {
        case ';' : retval.toktype = tokSemi; break;
        case '(' : retval.toktype = tokOpenParen; break;
        case ')' : retval.toktype = tokCloseParen; break;
    };
    
    if (retval.toktype != tokNil) {
        retval.lexeme = *iter;
        retval.end_iter = ++iter;
        return retval;
    }
    
    while (iter != end) {
        if (std::isalnum(*iter))
            retval.lexeme += *iter;
        else if (*iter == '_')
            retval.lexeme += '_';
        else
            break;
        
        ++iter;
    }
    
    if (iter == retval.start_iter) {
        // we didn't consume any input. (Except maybe spaces).
        // So just signal the end. Otherwise any outer loop
        // will spin forever.
        return token::mkend(end);
    }
    
    if (retval.lexeme == "var" )
        retval.toktype = tokVar;
    else if (retval.lexeme == "func" )
        retval.toktype = tokFunc;
    else
        retval.toktype = tokIdent;
        
    retval.end_iter = iter;

    
    return retval;
}